

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runtimes.cpp
# Opt level: O0

size_t fibonacci_swapped(size_t T,size_t N)

{
  future<void> *in_RSI;
  anon_class_16_2_fa5d95bb_for_f *in_RDI;
  size_t res;
  Executor executor;
  nullptr_t in_stack_fffffffffffffe58;
  Executor *this;
  Executor *in_stack_fffffffffffffe90;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  
  this = (Executor *)&stack0xfffffffffffffea8;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_RDI,in_stack_fffffffffffffe58);
  tf::Executor::Executor
            ((Executor *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (shared_ptr<tf::WorkerInterface> *)in_stack_ffffffffffffff48);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x115707);
  tf::Executor::async<fibonacci_swapped(unsigned_long,unsigned_long)::__0>(this,in_RDI);
  std::future<void>::get(in_RSI);
  std::future<void>::~future((future<void> *)0x11574a);
  tf::Executor::~Executor(in_stack_fffffffffffffe90);
  return (size_t)in_stack_fffffffffffffe90;
}

Assistant:

size_t fibonacci_swapped(size_t T, size_t N) {
  tf::Executor executor(T);
  size_t res;
  executor.async([N, &res](tf::Runtime& rt){ res = fibonacci_swapped(N, rt); }).get();
  return res;
}